

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int xmlParseElementStart(xmlParserCtxtPtr ctxt)

{
  int iVar1;
  _xmlNode *p_Var2;
  uint uVar3;
  int nsNr;
  xmlNodePtr ret;
  int tlen;
  int line;
  xmlParserNodeInfo node_info;
  xmlChar *URI;
  xmlChar *prefix;
  xmlChar *name;
  xmlParserCtxtPtr ctxt_local;
  
  URI = (xmlChar *)0x0;
  node_info.end_line = 0;
  ret._0_4_ = 0;
  iVar1 = ctxt->nsNr;
  name = (xmlChar *)ctxt;
  if ((xmlParserMaxDepth < (uint)ctxt->nameNr) && ((ctxt->options & 0x80000U) == 0)) {
    xmlFatalErrMsgInt(ctxt,XML_ERR_INTERNAL_ERROR,
                      "Excessive depth in document: %d use XML_PARSE_HUGE option\n",
                      xmlParserMaxDepth);
    xmlHaltParser((xmlParserCtxtPtr)name);
    ctxt_local._4_4_ = -1;
  }
  else {
    if (ctxt->record_info != 0) {
      node_info.node =
           (_xmlNode *)(ctxt->input->cur + (ctxt->input->consumed - (long)ctxt->input->base));
      node_info.begin_pos = (unsigned_long)ctxt->input->line;
    }
    if (ctxt->spaceNr == 0) {
      spacePush(ctxt,-1);
    }
    else if (*ctxt->space == -2) {
      spacePush(ctxt,-1);
    }
    else {
      spacePush(ctxt,*ctxt->space);
    }
    ret._4_4_ = *(int *)(*(long *)(name + 0x38) + 0x34);
    if (*(int *)(name + 0x1f8) == 0) {
      prefix = xmlParseStartTag((xmlParserCtxtPtr)name);
    }
    else {
      prefix = xmlParseStartTag2((xmlParserCtxtPtr)name,&URI,(xmlChar **)&node_info.end_line,
                                 (int *)&ret);
    }
    if (*(int *)(name + 0x110) == -1) {
      ctxt_local._4_4_ = -1;
    }
    else if (prefix == (xmlChar *)0x0) {
      spacePop((xmlParserCtxtPtr)name);
      ctxt_local._4_4_ = -1;
    }
    else {
      if (*(int *)(name + 0x1f8) == 0) {
        namePush((xmlParserCtxtPtr)name,prefix);
      }
      else {
        nameNsPush((xmlParserCtxtPtr)name,prefix,URI,(xmlChar *)node_info.end_line,
                   *(int *)(name + 0x1fc) - iVar1);
      }
      p_Var2 = *(_xmlNode **)(name + 0x50);
      if ((((*(int *)(name + 0x9c) != 0) && (*(int *)(name + 0x18) != 0)) &&
          (*(long *)(name + 0x10) != 0)) &&
         ((*(long *)(name + 0x50) != 0 &&
          (*(long *)(name + 0x50) == *(long *)(*(long *)(name + 0x10) + 0x18))))) {
        uVar3 = xmlValidateRoot((xmlValidCtxtPtr)(name + 0xa0),*(xmlDocPtr *)(name + 0x10));
        *(uint *)(name + 0x98) = uVar3 & *(uint *)(name + 0x98);
      }
      _tlen = p_Var2;
      if ((((*(int *)(name + 0x2f0) == 1) && (**(char **)(*(long *)(name + 0x38) + 0x20) == '/')) &&
          (*(char *)(*(long *)(*(long *)(name + 0x38) + 0x20) + 1) == '>')) ||
         ((*(int *)(name + 0x2f0) == 2 &&
          (((**(char **)(*(long *)(name + 0x38) + 0x20) == '\n' ||
            (**(char **)(*(long *)(name + 0x38) + 0x20) == ';')) ||
           (**(char **)(*(long *)(name + 0x38) + 0x20) == '}')))))) {
        if (*(int *)(name + 0x2f0) == 1) {
          *(long *)(*(long *)(name + 0x38) + 0x20) = *(long *)(*(long *)(name + 0x38) + 0x20) + 2;
          *(int *)(*(long *)(name + 0x38) + 0x38) = *(int *)(*(long *)(name + 0x38) + 0x38) + 2;
          if (**(char **)(*(long *)(name + 0x38) + 0x20) == '\0') {
            xmlParserInputGrow(*(xmlParserInputPtr *)(name + 0x38),0xfa);
          }
        }
        else if (**(char **)(*(long *)(name + 0x38) + 0x20) == ';') {
          *(long *)(*(long *)(name + 0x38) + 0x20) = *(long *)(*(long *)(name + 0x38) + 0x20) + 1;
          *(int *)(*(long *)(name + 0x38) + 0x38) = *(int *)(*(long *)(name + 0x38) + 0x38) + 1;
          if (**(char **)(*(long *)(name + 0x38) + 0x20) == '\0') {
            xmlParserInputGrow(*(xmlParserInputPtr *)(name + 0x38),0xfa);
          }
        }
        if (*(int *)(name + 0x1f8) == 0) {
          if (((*(long *)name != 0) && (*(long *)(*(long *)name + 0x78) != 0)) &&
             (*(int *)(name + 0x14c) == 0)) {
            (**(code **)(*(long *)name + 0x78))(*(undefined8 *)(name + 8),prefix);
          }
        }
        else if (((*(long *)name != 0) && (*(long *)(*(long *)name + 0xf0) != 0)) &&
                (*(int *)(name + 0x14c) == 0)) {
          (**(code **)(*(long *)name + 0xf0))
                    (*(undefined8 *)(name + 8),prefix,URI,node_info.end_line);
        }
        namePop((xmlParserCtxtPtr)name);
        spacePop((xmlParserCtxtPtr)name);
        if (iVar1 != *(int *)(name + 0x1fc)) {
          nsPop((xmlParserCtxtPtr)name,*(int *)(name + 0x1fc) - iVar1);
        }
        if ((p_Var2 != (_xmlNode *)0x0) && (*(int *)(name + 0x68) != 0)) {
          node_info.begin_line =
               *(long *)(*(long *)(name + 0x38) + 0x40) +
               (*(long *)(*(long *)(name + 0x38) + 0x20) - *(long *)(*(long *)(name + 0x38) + 0x18))
          ;
          node_info.end_pos = (unsigned_long)*(int *)(*(long *)(name + 0x38) + 0x34);
          xmlParserAddNodeInfo((xmlParserCtxtPtr)name,(xmlParserNodeInfoPtr)&tlen);
        }
        ctxt_local._4_4_ = 1;
      }
      else {
        if (*(int *)(name + 0x2f0) == 1) {
          if (**(char **)(*(long *)(name + 0x38) + 0x20) != '>') {
            xmlFatalErrMsgStrIntStr
                      ((xmlParserCtxtPtr)name,XML_ERR_GT_REQUIRED,
                       "Couldn\'t find end of Start Tag %s line %d\n",prefix,ret._4_4_,
                       (xmlChar *)0x0);
            nodePop((xmlParserCtxtPtr)name);
            namePop((xmlParserCtxtPtr)name);
            spacePop((xmlParserCtxtPtr)name);
            if (iVar1 != *(int *)(name + 0x1fc)) {
              nsPop((xmlParserCtxtPtr)name,*(int *)(name + 0x1fc) - iVar1);
            }
            if ((p_Var2 != (_xmlNode *)0x0) && (*(int *)(name + 0x68) != 0)) {
              node_info.begin_line =
                   *(long *)(*(long *)(name + 0x38) + 0x40) +
                   (*(long *)(*(long *)(name + 0x38) + 0x20) -
                   *(long *)(*(long *)(name + 0x38) + 0x18));
              node_info.end_pos = (unsigned_long)*(int *)(*(long *)(name + 0x38) + 0x34);
              xmlParserAddNodeInfo((xmlParserCtxtPtr)name,(xmlParserNodeInfoPtr)&tlen);
            }
            return -1;
          }
          *(int *)(*(long *)(name + 0x38) + 0x38) = *(int *)(*(long *)(name + 0x38) + 0x38) + 1;
          *(long *)(*(long *)(name + 0x38) + 0x20) = *(long *)(*(long *)(name + 0x38) + 0x20) + 1;
          if (**(char **)(*(long *)(name + 0x38) + 0x20) == '\0') {
            xmlParserInputGrow(*(xmlParserInputPtr *)(name + 0x38),0xfa);
          }
        }
        else if (**(char **)(*(long *)(name + 0x38) + 0x20) == '{') {
          name[0x2f4] = '\x01';
          name[0x2f5] = '\0';
          name[0x2f6] = '\0';
          name[0x2f7] = '\0';
          *(int *)(*(long *)(name + 0x38) + 0x38) = *(int *)(*(long *)(name + 0x38) + 0x38) + 1;
          *(long *)(*(long *)(name + 0x38) + 0x20) = *(long *)(*(long *)(name + 0x38) + 0x20) + 1;
          if (**(char **)(*(long *)(name + 0x38) + 0x20) == '\0') {
            xmlParserInputGrow(*(xmlParserInputPtr *)(name + 0x38),0xfa);
          }
        }
        else {
          name[0x2f4] = '\0';
          name[0x2f5] = '\0';
          name[0x2f6] = '\0';
          name[0x2f7] = '\0';
        }
        ctxt_local._4_4_ = 0;
      }
    }
  }
  return ctxt_local._4_4_;
}

Assistant:

static int
xmlParseElementStart(xmlParserCtxtPtr ctxt) {
    const xmlChar *name;
    const xmlChar *prefix = NULL;
    const xmlChar *URI = NULL;
    xmlParserNodeInfo node_info;
    int line, tlen = 0;
    xmlNodePtr ret;
    int nsNr = ctxt->nsNr;

    DEBUG_ENTER(("xmlParseElementStart(%s);\n", dbgCtxt(ctxt)));

    if (((unsigned int) ctxt->nameNr > xmlParserMaxDepth) &&
        ((ctxt->options & XML_PARSE_HUGE) == 0)) {
	xmlFatalErrMsgInt(ctxt, XML_ERR_INTERNAL_ERROR,
		 "Excessive depth in document: %d use XML_PARSE_HUGE option\n",
			  xmlParserMaxDepth);
	xmlHaltParser(ctxt);
	RETURN_INT(-1);
    }

    /* Capture start position */
    if (ctxt->record_info) {
        node_info.begin_pos = ctxt->input->consumed +
                          (CUR_PTR - ctxt->input->base);
	node_info.begin_line = ctxt->input->line;
    }

    /* TODO FOR SML: Move ctxt->curly to one of these spaces, to avoid having to save it manually? */
    if (ctxt->spaceNr == 0)
	spacePush(ctxt, -1);
    else if (*ctxt->space == -2)
	spacePush(ctxt, -1);
    else
	spacePush(ctxt, *ctxt->space);

    line = ctxt->input->line;
#ifdef LIBXML_SAX1_ENABLED
    if (ctxt->sax2)
#endif /* LIBXML_SAX1_ENABLED */
        name = xmlParseStartTag2(ctxt, &prefix, &URI, &tlen);
#ifdef LIBXML_SAX1_ENABLED
    else
	name = xmlParseStartTag(ctxt);
#endif /* LIBXML_SAX1_ENABLED */
    if (ctxt->instate == XML_PARSER_EOF)
	RETURN_INT(-1);
    if (name == NULL) {
	spacePop(ctxt);
        RETURN_INT(-1);
    }
    if (ctxt->sax2)
        nameNsPush(ctxt, name, prefix, URI, ctxt->nsNr - nsNr);
#ifdef LIBXML_SAX1_ENABLED
    else
        namePush(ctxt, name);
#endif /* LIBXML_SAX1_ENABLED */
    ret = ctxt->node;

#ifdef LIBXML_VALID_ENABLED
    /*
     * [ VC: Root Element Type ]
     * The Name in the document type declaration must match the element
     * type of the root element.
     */
    if (ctxt->validate && ctxt->wellFormed && ctxt->myDoc &&
        ctxt->node && (ctxt->node == ctxt->myDoc->children))
        ctxt->valid &= xmlValidateRoot(&ctxt->vctxt, ctxt->myDoc);
#endif /* LIBXML_VALID_ENABLED */

    /*
     * Check for an Empty Element.
     */
    if (   (ISXML && (RAW == '/') && (NXT(1) == '>'))
    	|| (ISSML && ((RAW == '\n') || (RAW == ';') || (RAW == '}')))) {
        if (ISXML) {						/* XML */
            SKIP(2);
        } else {						/* SML */
            if (RAW == ';') { /* But do not skip '}', which can't belong to an empty element */
		SKIP(1);
            }
        }
	if (ctxt->sax2) {
	    if ((ctxt->sax != NULL) && (ctxt->sax->endElementNs != NULL) &&
		(!ctxt->disableSAX))
		ctxt->sax->endElementNs(ctxt->userData, name, prefix, URI);
#ifdef LIBXML_SAX1_ENABLED
	} else {
	    if ((ctxt->sax != NULL) && (ctxt->sax->endElement != NULL) &&
		(!ctxt->disableSAX))
		ctxt->sax->endElement(ctxt->userData, name);
#endif /* LIBXML_SAX1_ENABLED */
	}
	namePop(ctxt);
	spacePop(ctxt);
	if (nsNr != ctxt->nsNr)
	    nsPop(ctxt, ctxt->nsNr - nsNr);
	if ( ret != NULL && ctxt->record_info ) {
	   node_info.end_pos = ctxt->input->consumed +
			      (CUR_PTR - ctxt->input->base);
	   node_info.end_line = ctxt->input->line;
	   node_info.node = ret;
	   xmlParserAddNodeInfo(ctxt, &node_info);
	}
	RETURN_INT_COMMENT(1, ("xmlParseElement. ctxt = %s;\n", dbgCtxt(ctxt)));
    }
    if (ISXML) {						/* XML */
	if (RAW == '>') {
	    NEXT1;
	} else {
	    xmlFatalErrMsgStrIntStr(ctxt, XML_ERR_GT_REQUIRED,
			 "Couldn't find end of Start Tag %s line %d\n",
				    name, line, NULL);

	    /*
	     * end of parsing of this node.
	     */
	    nodePop(ctxt);
	    namePop(ctxt);
	    spacePop(ctxt);
	    if (nsNr != ctxt->nsNr)
		nsPop(ctxt, ctxt->nsNr - nsNr);

	    /*
	     * Capture end position and add node
	     */
	    if ( ret != NULL && ctxt->record_info ) {
	       node_info.end_pos = ctxt->input->consumed +
				  (CUR_PTR - ctxt->input->base);
	       node_info.end_line = ctxt->input->line;
	       node_info.node = ret;
	       xmlParserAddNodeInfo(ctxt, &node_info);
	    }
	RETURN_INT_COMMENT(-1, ("xmlParseElement. ctxt = %s;\n", dbgCtxt(ctxt)));
	}
    } else {							/* SML */
	if (RAW == '{') {
	    ctxt->curly = 1;
	    NEXT1;
	} else {
	    ctxt->curly = 0;
	}
	DEBUG_PRINTF(("curly = %d;\n", ctxt->curly));
    	/* TODO FOR SML: Is there any test to do here to detect and report invalid tag definitions? */
    }

    RETURN_INT(0);
}